

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::Canceler::cancel(Canceler *this,Exception *exception)

{
  AdapterBase *pAVar1;
  Maybe<kj::Canceler::AdapterBase_&> *pMVar2;
  AdapterBase *pAVar3;
  Maybe<kj::Canceler::AdapterBase_&> *p;
  AdapterBase *n;
  Exception local_1b0;
  
  do {
    pAVar1 = (this->list).ptr;
    if (pAVar1 == (AdapterBase *)0x0) {
      return;
    }
    pMVar2 = (pAVar1->prev).ptr;
    if (pMVar2 != (Maybe<kj::Canceler::AdapterBase_&> *)0x0) {
      pMVar2->ptr = (pAVar1->next).ptr;
    }
    pAVar3 = (pAVar1->next).ptr;
    if (pAVar3 != (AdapterBase *)0x0) {
      (pAVar3->prev).ptr = pMVar2;
    }
    (pAVar1->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
    (pAVar1->next).ptr = (AdapterBase *)0x0;
    Exception::Exception(&local_1b0,exception);
    (**pAVar1->_vptr_AdapterBase)(pAVar1,&local_1b0);
    Exception::~Exception(&local_1b0);
  } while (pAVar1 != (AdapterBase *)0x0);
  return;
}

Assistant:

void Canceler::cancel(const Exception& exception) {
  for (;;) {
    KJ_IF_SOME(a, list) {
      a.unlink();
      a.cancel(kj::cp(exception));
    } else {
      break;
    }
  }